

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseFlattening.cpp
# Opt level: O3

Clause * FMB::ClauseFlattening::resolveNegativeVariableEqualities(Clause *cl)

{
  Literal *pLVar1;
  Term *trm;
  TermList trm_00;
  Self SVar2;
  ulong in_RAX;
  Term *pTVar3;
  TermList sort;
  Literal **ppLVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  uint uVar8;
  uint i;
  ulong unaff_R13;
  uint uVar9;
  SingleVar2VarSubst subst;
  RStack<Literal_*> resLits;
  SingleVar2VarSubst local_a0;
  ulong local_98;
  ulong local_90;
  Clause *local_88;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  NonspecificInference1 local_70;
  Inference local_60;
  
  uVar9 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar8 = 0;
  local_98 = in_RAX;
LAB_00285cea:
  if (uVar8 < uVar9) {
    do {
      pLVar1 = cl->_literals[(int)uVar8];
      if (((pLVar1->super_Term)._functor == 0) &&
         (((pLVar1->super_Term)._args[0]._content & 4) == 0)) {
        uVar5 = *(uint *)&(pLVar1->super_Term).field_0xc & 0xfffffff;
        local_98 = (pLVar1->super_Term)._args[uVar5]._content;
        if (((local_98 & 1) != 0) &&
           (uVar6 = (pLVar1->super_Term)._args[(ulong)uVar5 - 1]._content, (uVar6 & 1) != 0))
        goto LAB_00285d31;
      }
      uVar8 = uVar8 + 1;
      if (uVar9 <= uVar8) {
        return cl;
      }
    } while( true );
  }
  goto LAB_00285d4a;
LAB_00285d31:
  local_98 = local_98 >> 2;
  unaff_R13 = uVar6 >> 2;
  local_a0._from = (uint)local_98;
  local_a0._to = (uint)unaff_R13;
LAB_00285d4a:
  if (uVar9 <= uVar8) {
    return cl;
  }
  local_90 = unaff_R13;
  local_88 = cl;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  uVar5 = 0;
  uVar7 = extraout_RDX;
  do {
    SVar2._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )local_80._self;
    if (uVar8 != uVar5) {
      trm = &local_88->_literals[(int)uVar5]->super_Term;
      pTVar3 = trm;
      if ((((int)local_98 != (int)local_90) &&
          (pTVar3 = Kernel::SubstHelper::
                    applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                              (trm,&local_a0,SUB81(uVar7,0)), uVar7 = extraout_RDX_00,
          *(int *)&pTVar3->field_0xc < 0)) &&
         (trm_00._content = (trm->field_9)._sort._content,
         sort = Kernel::SubstHelper::
                applyImpl<false,FMB::ClauseFlattening::resolveNegativeVariableEqualities(Kernel::Clause*)::SingleVar2VarSubst>
                          (trm_00,&local_a0,SUB81(extraout_RDX_00,0)), uVar7 = extraout_RDX_01,
         trm_00._content != sort._content)) {
        uVar6 = (ulong)(*(uint *)&pTVar3->field_0xc & 0xfffffff);
        pTVar3 = &Kernel::Literal::createEquality
                            (SUB41(((uint)pTVar3->_args[0]._content & 4) >> 2,0),
                             (TermList)pTVar3->_args[uVar6]._content,
                             (TermList)pTVar3->_args[uVar6 - 1]._content,sort)->super_Term;
        uVar7 = extraout_RDX_03;
      }
      ppLVar4 = *(Literal ***)
                 ((long)SVar2._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      if (ppLVar4 ==
          *(Literal ***)
           ((long)SVar2._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18
           )) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   SVar2._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        ppLVar4 = *(Literal ***)
                   ((long)SVar2._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        uVar7 = extraout_RDX_02;
      }
      *ppLVar4 = (Literal *)pTVar3;
      *(Literal ***)
       ((long)SVar2._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           *(Literal ***)
            ((long)SVar2._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
            0x10) + 1;
    }
    SVar2._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
         local_80._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
         .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
    uVar5 = uVar5 + 1;
  } while (uVar9 != uVar5);
  local_70.rule = EQUALITY_RESOLUTION;
  local_70.premise = &local_88->super_Unit;
  Kernel::Inference::Inference(&local_60,&local_70);
  cl = Kernel::Clause::fromStack
                 ((Stack<Kernel::Literal_*> *)
                  SVar2._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                  &local_60);
  unaff_R13 = local_90;
  uVar9 = uVar9 - 1;
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  goto LAB_00285cea;
}

Assistant:

Clause* ClauseFlattening::resolveNegativeVariableEqualities(Clause* cl)
{
  // a helper class to be passed to SubstHelper
  class SingleVar2VarSubst {
    unsigned _from;
    unsigned _to;
  public:
    void bind(unsigned from,unsigned to) {
      _from = from;
      _to = to;
    }
    bool isId() {
      return (_from == _to);
    }
    TermList apply(unsigned var) {
      if (var == _from) {
        return TermList(_to, false);
      } else {
        return TermList(var, false);
      }
    }
  } subst;

  // cout << "Begin: " << cl->toString() << endl;

  unsigned n = cl->length();
  unsigned idx = 0;
  while (true) {
    // scan cl from where we ended last time and look for a new negative two variable equality
    while(idx < n) {
      Literal* lit = (*cl)[idx];
      if (lit->isEquality() && lit->isNegative() && lit->nthArgument(0)->isVar() && lit->nthArgument(1)->isVar()) {
        subst.bind(lit->nthArgument(0)->var(),lit->nthArgument(1)->var());
        break;
      }
      idx++;
    }
    if (idx < n) { // we found one
      // new clause one lit shorter
      RStack<Literal*> resLits;
      for (unsigned i = 0; i < n; i++) {
        if (i != idx) { // skipping literal found at idx
          resLits->push(subst.isId() ? (*cl)[i] : SubstHelper::apply((*cl)[i],subst));
        }
      }
      cl = Clause::fromStack(*resLits, NonspecificInference1(InferenceRule::EQUALITY_RESOLUTION,cl));
      n--;
      // cout << "Update: " << cl->toString() << endl;
    } else {
      // cout << "Done: " << cl->toString() << endl;
      return cl;
    }
  }
}